

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::addQualifierToExisting
          (HlslParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  TSymbol *shared;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_iterator cVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  undefined4 extraout_var_03;
  pointer pcVar6;
  char *pcVar7;
  ulong uVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  
  shared = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                              (bool *)0x0,(int *)0x0);
  if (shared == (TSymbol *)0x0) {
    pcVar6 = (identifier->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar7 = "identifier not previously declared";
  }
  else {
    iVar3 = (*shared->_vptr_TSymbol[7])(shared);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      if (((((CONCAT44(qualifier._12_4_,qualifier._8_4_) & 0x3fff1e0e0000000) != 0) ||
           (bVar2 = TQualifier::hasNonXfbLayout(&qualifier), bVar2)) ||
          ((qualifier._36_4_ & 0x7fffffff) != 0x7fffffff)) || ((qualifier._8_4_ & 0xe00007f) != 0))
      {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
                   ,(identifier->_M_dataplus)._M_p,"");
        return;
      }
      iVar3 = (*shared->_vptr_TSymbol[0x14])(shared);
      if ((char)iVar3 != '\0') {
        shared = TSymbolTable::copyUp((this->super_TParseContextBase).symbolTable,shared);
      }
      if (((uint)qualifier._8_4_ >> 0x1c & 1) == 0) {
        if ((qualifier._12_4_ & 0x10) != 0) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                  ::find(&(pTVar1->ioAccessed)._M_t,identifier);
          if ((_Rb_tree_header *)cVar4._M_node !=
              &(pTVar1->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change qualification after use","precise","");
          }
          iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
          lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x50))
                            ((long *)CONCAT44(extraout_var_01,iVar3));
          *(ulong *)(lVar5 + 8) = *(ulong *)(lVar5 + 8) | 0x1000000000;
          return;
        }
        if ((qualifier._12_4_ & 1) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,loc,"unknown requalification","","");
          return;
        }
        iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x50))
                          ((long *)CONCAT44(extraout_var_02,iVar3));
        *(ulong *)(lVar5 + 8) = (*(ulong *)(lVar5 + 8) & 0xfffffffeffffff80) + 0x100000002;
        uVar8 = qualifier._36_8_ & 0x7ff0000000000;
        if (uVar8 == 0x7ff0000000000) {
          return;
        }
        iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x50))
                          ((long *)CONCAT44(extraout_var_03,iVar3));
        *(ulong *)(lVar5 + 0x24) = *(ulong *)(lVar5 + 0x24) & 0xfff800ffffffffff | uVar8;
        return;
      }
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&(pTVar1->ioAccessed)._M_t,identifier);
      if ((_Rb_tree_header *)cVar4._M_node !=
          &(pTVar1->ioAccessed)._M_t._M_impl.super__Rb_tree_header) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"cannot change qualification after use","invariant","");
      }
      iVar3 = (*shared->_vptr_TSymbol[0xd])(shared);
      lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      *(byte *)(lVar5 + 0xb) = *(byte *)(lVar5 + 0xb) | 0x10;
      return;
    }
    pcVar6 = (identifier->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar7 = "cannot re-qualify a function name";
  }
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar7,pcVar6,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);
    if (symbol == nullptr) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
    } else if (qualifier.noContraction) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().noContraction = true;
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}